

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::DatatypeValidator> *objToStore,XSerializeEngine *serEng)

{
  XMLSize_t t;
  bool bVar1;
  DatatypeValidator *dv;
  XMLSize_t i;
  XMLSize_t getAt;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (objToStore->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>).fCurCount;
    XSerializeEngine::writeSize(serEng,t);
    for (getAt = 0; t != getAt; getAt = getAt + 1) {
      dv = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                     (&objToStore->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,getAt);
      DatatypeValidator::storeDV(serEng,dv);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<DatatypeValidator>* const objToStore
                                    , XSerializeEngine&                      serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            DatatypeValidator* data = objToStore->elementAt(i);
            DatatypeValidator::storeDV(serEng, data);
        }
    }

}